

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O3

void __thiscall
optimization::global_expr_move::BlockOps::BlockOps(BlockOps *this,BasicBlk *blk,bool offset)

{
  _Rb_tree_header *p_Var1;
  __index_type _Var2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar6;
  _Base_ptr p_Var7;
  undefined7 in_register_00000011;
  _Base_ptr p_Var8;
  pointer puVar9;
  Inst *pIVar10;
  _Array_type *__vtable;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  pointer puVar11;
  bool bVar12;
  __hashtable *__h;
  anon_class_8_1_a78179b7_conflict local_158;
  BlockOps *local_150;
  undefined4 local_144;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *local_140;
  _Rb_tree<std::pair<mir::inst::VarId,mir::inst::Value>,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>,std::_Select1st<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>,std::less<std::pair<mir::inst::VarId,mir::inst::Value>>,std::allocator<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>>
  *local_138;
  _Base_ptr local_130;
  undefined **local_128;
  undefined **local_120;
  undefined **local_118;
  undefined1 local_110 [17];
  undefined2 uStack_ff;
  undefined5 uStack_fd;
  variant<int,_mir::inst::VarId> local_f8;
  _func_int **local_e0;
  pointer local_d8;
  _func_int **local_d0;
  undefined1 local_c8 [16];
  undefined **local_b8;
  undefined1 local_b0 [24];
  undefined **local_98 [2];
  __index_type local_88;
  undefined2 local_87;
  undefined **local_80;
  uint32_t local_78;
  undefined **local_70;
  variant<int,_mir::inst::VarId> local_68;
  undefined **local_50;
  variant<int,_mir::inst::VarId> local_48;
  
  local_144 = (undefined4)CONCAT71(in_register_00000011,offset);
  (this->ops)._M_h._M_buckets = &(this->ops)._M_h._M_single_bucket;
  (this->ops)._M_h._M_bucket_count = 1;
  (this->ops)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ops)._M_h._M_element_count = 0;
  (this->ops)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ops)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ops)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->loads)._M_t._M_impl.super__Rb_tree_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130 = &(this->stores)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_130;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_130;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar11 = (blk->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (blk->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != puVar9) {
    local_138 = (_Rb_tree<std::pair<mir::inst::VarId,mir::inst::Value>,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>,std::_Select1st<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>,std::less<std::pair<mir::inst::VarId,mir::inst::Value>>,std::allocator<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>>
                 *)&this->loads;
    local_140 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                 *)&this->stores;
    local_d0 = (_func_int **)&PTR_display_001ed048;
    local_e0 = (_func_int **)&PTR_display_001ed228;
    local_150 = this;
    local_d8 = puVar9;
    do {
      pIVar10 = (puVar11->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      iVar5 = (*(pIVar10->super_Displayable)._vptr_Displayable[1])(pIVar10);
      if (iVar5 == 1) {
        if ((pIVar10->super_Displayable)._vptr_Displayable != local_d0) {
          pIVar10 = (Inst *)0x0;
        }
        uVar3 = pIVar10[3].dest.id;
        local_48.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
             *(__index_type *)&pIVar10[2].super_Displayable._vptr_Displayable;
        local_158.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_48;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_48.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_158,(variant<int,_mir::inst::VarId> *)&pIVar10[1].dest);
        local_50 = &PTR_display_001ecf98;
        local_48.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
             *(undefined2 *)((long)&pIVar10[2].super_Displayable._vptr_Displayable + 1);
        local_68.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
             *(__index_type *)&pIVar10[3].dest.super_Displayable._vptr_Displayable;
        local_158.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_68;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_68.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_158,(variant<int,_mir::inst::VarId> *)&pIVar10[2].dest.id);
        local_70 = &PTR_display_001ecf98;
        local_68.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
             *(undefined2 *)((long)&pIVar10[3].dest.super_Displayable._vptr_Displayable + 1);
        local_128 = (undefined **)CONCAT44(local_128._4_4_,uVar3);
        local_110[8] = local_48.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
        local_158.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_118;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_48.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_158,&local_48);
        local_120 = &PTR_display_001ecf98;
        local_110._9_2_ =
             local_48.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
        local_f8.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
             local_68.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
        local_158.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_f8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_68.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_158,&local_68);
        stack0xffffffffffffff00 = &PTR_display_001ecf98;
        local_f8.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
             local_68.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
        local_c8._0_4_ = local_128._0_4_;
        local_b0[8] = local_110[8];
        local_158.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_b8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_110[8] + 1]._M_data)
                  (&local_158,(variant<int,_mir::inst::VarId> *)&local_118);
        local_c8._8_8_ = &PTR_display_001ecf98;
        local_b0._9_2_ = local_110._9_2_;
        local_88 = local_f8.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
        local_158.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)local_98;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_f8.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_158,&local_f8);
        local_b0._16_8_ = &PTR_display_001ecf98;
        local_87 = local_f8.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
        local_80 = &PTR_display_001eb100;
        local_78 = (pIVar10->dest).id;
        std::
        _Hashtable<optimization::global_expr_move::Op,std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>,std::allocator<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>,std::__detail::_Select1st,std::equal_to<optimization::global_expr_move::Op>,optimization::global_expr_move::hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>
                  ((_Hashtable<optimization::global_expr_move::Op,std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>,std::allocator<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>,std::__detail::_Select1st,std::equal_to<optimization::global_expr_move::Op>,optimization::global_expr_move::hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_150,local_c8);
        puVar9 = local_d8;
      }
      else if ((char)local_144 != '\0') {
        iVar5 = (*(((puVar11->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[1])();
        if (iVar5 == 3) {
          if ((pIVar10->super_Displayable)._vptr_Displayable != local_e0) {
            pIVar10 = (Inst *)0x0;
          }
          pvVar6 = std::get<1ul,int,mir::inst::VarId>
                             ((variant<int,_mir::inst::VarId> *)&pIVar10[1].dest);
          uVar4 = pvVar6->id;
          p_Var7 = (local_150->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = local_130;
          if (p_Var7 != (_Base_ptr)0x0) {
            do {
              bVar12 = *(uint *)&p_Var7[1]._M_parent < uVar4;
              if (!bVar12) {
                p_Var8 = p_Var7;
              }
              p_Var7 = (&p_Var7->_M_left)[bVar12];
            } while (p_Var7 != (_Base_ptr)0x0);
            if ((p_Var8 != local_130) && (*(uint *)&p_Var8[1]._M_parent <= uVar4))
            goto LAB_00131626;
          }
          local_128 = &PTR_display_001eb100;
          local_120 = (undefined **)CONCAT44(local_120._4_4_,uVar4);
          _Var2 = *(__index_type *)&pIVar10[3].dest.super_Displayable._vptr_Displayable;
          local_110[0x10] = _Var2;
          local_158.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)local_110;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
            ::_S_vtable._M_arr[(long)(char)_Var2 + 1]._M_data)
                    (&local_158,(variant<int,_mir::inst::VarId> *)&pIVar10[2].dest.id);
          local_118 = &PTR_display_001ecf98;
          stack0xffffffffffffff00 =
               CONCAT21(*(undefined2 *)
                         ((long)&pIVar10[3].dest.super_Displayable._vptr_Displayable + 1),
                        local_110[0x10]);
          local_c8._0_8_ = &PTR_display_001eb100;
          local_c8._8_4_ = local_120._0_4_;
          local_b0[0x10] = local_110[0x10];
          local_158.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)local_b0;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
            ::_S_vtable._M_arr[(long)(char)local_110[0x10] + 1]._M_data)
                    (&local_158,(variant<int,_mir::inst::VarId> *)local_110);
          local_b8 = &PTR_display_001ecf98;
          local_b0._17_2_ = uStack_ff;
          local_98[0] = &PTR_display_001eb100;
          local_98[1]._0_4_ = (pIVar10->dest).id;
          std::
          _Rb_tree<std::pair<mir::inst::VarId,mir::inst::Value>,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>,std::_Select1st<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>,std::less<std::pair<mir::inst::VarId,mir::inst::Value>>,std::allocator<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>>
          ::
          _M_insert_unique<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>
                    (local_138,
                     (pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *)
                     local_c8);
        }
        else {
          iVar5 = (*(((puVar11->_M_t).
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                    super_Displayable)._vptr_Displayable[1])();
          if (iVar5 == 4) {
            std::
            _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
            ::_M_insert_unique<mir::inst::VarId_const&>(local_140,&pIVar10->dest);
          }
        }
      }
LAB_00131626:
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar9);
  }
  return;
}

Assistant:

BlockOps(mir::inst::BasicBlk& blk, bool offset = false) {
    for (auto& inst : blk.inst) {
      auto& i = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Op) {
        auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
        ops.insert({Op(opInst->op, opInst->lhs, opInst->rhs), opInst->dest});
      } else if (offset) {
        if (inst->inst_kind() == mir::inst::InstKind::Load) {
          auto loadInst = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
          auto addr = std::get<mir::inst::VarId>(loadInst->src);
          if (stores.count(addr)) {
            continue;
          }
          loads.insert({{addr, loadInst->offset}, loadInst->dest});
        } else if (inst->inst_kind() == mir::inst::InstKind::Store) {
          auto storeInst = dynamic_cast<mir::inst::StoreOffsetInst*>(&i);
          stores.insert(storeInst->dest);
        }
      }
    }
  }